

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

uint32_t helper_rsqrtsf_f16_aarch64(uint32_t a,uint32_t b,void *fpstp)

{
  float16 fVar1;
  float16 a_00;
  int iVar2;
  float_status *fpst;
  void *fpstp_local;
  uint32_t b_local;
  uint32_t a_local;
  
  fVar1 = float16_squash_input_denormal_aarch64((float16)a,(float_status *)fpstp);
  a_00 = float16_squash_input_denormal_aarch64((float16)b,(float_status *)fpstp);
  fVar1 = float16_chs(fVar1);
  iVar2 = float16_is_infinity(fVar1);
  if (iVar2 == 0) {
LAB_006f69e5:
    iVar2 = float16_is_infinity(a_00);
    if (iVar2 != 0) {
      iVar2 = float16_is_zero(fVar1);
      if (iVar2 != 0) goto LAB_006f6a05;
    }
    fVar1 = float16_muladd_aarch64(fVar1,a_00,0x4200,8,(float_status *)fpstp);
    b_local = (uint32_t)fVar1;
  }
  else {
    iVar2 = float16_is_zero(a_00);
    if (iVar2 == 0) goto LAB_006f69e5;
LAB_006f6a05:
    b_local = 0x3e00;
  }
  return b_local;
}

Assistant:

uint32_t HELPER(rsqrtsf_f16)(uint32_t a, uint32_t b, void *fpstp)
{
    float_status *fpst = fpstp;

    a = float16_squash_input_denormal(a, fpst);
    b = float16_squash_input_denormal(b, fpst);

    a = float16_chs(a);
    if ((float16_is_infinity(a) && float16_is_zero(b)) ||
        (float16_is_infinity(b) && float16_is_zero(a))) {
        return float16_one_point_five;
    }
    return float16_muladd(a, b, float16_three, float_muladd_halve_result, fpst);
}